

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_filesystem.cpp
# Opt level: O2

void test_translate_paths(test_table *table,char *universal,char *os)

{
  uint64_t uVar1;
  byte bVar2;
  bool bVar3;
  char *pcVar4;
  int64_t iVar5;
  uint64_t *puVar6;
  
  puVar6 = table->result;
  if (puVar6 != (uint64_t *)0x0) {
    *puVar6 = 0;
  }
  pcVar4 = (*ne_filesystem_translate_universal_to_os)(puVar6,universal);
  if (table->result != (uint64_t *)0x0) {
    uVar1 = *table->result;
    bVar2 = test_validate(uVar1 == table->expected_result,uVar1,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0x60,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
    table->success = table->success & bVar2;
  }
  iVar5 = test_string_compare(pcVar4,os);
  bVar2 = test_validate(iVar5 == 0,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0x61,"TEST_EXPECT(test_string_compare(test_os, os) == 0) failed\n");
  table->success = table->success & bVar2;
  bVar3 = validate_any_path(pcVar4);
  bVar2 = test_validate(bVar3,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0x62,"TEST_EXPECT(validate_any_path(test_os)) failed\n");
  table->success = table->success & bVar2;
  puVar6 = table->result;
  if (puVar6 != (uint64_t *)0x0) {
    *puVar6 = 0;
  }
  (*ne_core_free)(puVar6,pcVar4);
  if (table->result != (uint64_t *)0x0) {
    uVar1 = *table->result;
    bVar2 = test_validate(uVar1 == table->expected_result,uVar1,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0x66,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
    table->success = table->success & bVar2;
    puVar6 = table->result;
    if (puVar6 != (uint64_t *)0x0) {
      *puVar6 = 0;
      goto LAB_0010aa94;
    }
  }
  puVar6 = (uint64_t *)0x0;
LAB_0010aa94:
  pcVar4 = (*ne_filesystem_translate_os_to_universal)(puVar6,os);
  if (table->result != (uint64_t *)0x0) {
    uVar1 = *table->result;
    bVar2 = test_validate(uVar1 == table->expected_result,uVar1,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0x6b,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
    table->success = table->success & bVar2;
  }
  iVar5 = test_string_compare(pcVar4,universal);
  bVar2 = test_validate(iVar5 == 0,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0x6c,
                        "TEST_EXPECT(test_string_compare(test_universal, universal) == 0) failed\n")
  ;
  table->success = table->success & bVar2;
  bVar3 = validate_universal_canonical_path(pcVar4);
  bVar2 = test_validate(bVar3,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                        ,0x6d,
                        "TEST_EXPECT(validate_universal_canonical_path(test_universal)) failed\n");
  table->success = table->success & bVar2;
  puVar6 = table->result;
  if (puVar6 != (uint64_t *)0x0) {
    *puVar6 = 0;
  }
  (*ne_core_free)(puVar6,pcVar4);
  if (table->result != (uint64_t *)0x0) {
    uVar1 = *table->result;
    bVar2 = test_validate(uVar1 == table->expected_result,uVar1,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test_filesystem/test_filesystem.cpp"
                          ,0x71,"TEST_EXPECT_RESULT(table->expected_result) failed\n");
    table->success = table->success & bVar2;
  }
  return;
}

Assistant:

static void test_translate_paths(test_table *table,
                                 const char *universal,
                                 const char *os)
{
  TEST_CLEAR_RESULT();
  char *test_os =
      ne_filesystem_translate_universal_to_os(table->result, universal);
  TEST_EXPECT_TABLE_RESULT();
  TEST_EXPECT(test_string_compare(test_os, os) == 0);
  TEST_EXPECT(validate_any_path(test_os));

  TEST_CLEAR_RESULT();
  ne_core_free(table->result, test_os);
  TEST_EXPECT_TABLE_RESULT();

  TEST_CLEAR_RESULT();
  char *test_universal =
      ne_filesystem_translate_os_to_universal(table->result, os);
  TEST_EXPECT_TABLE_RESULT();
  TEST_EXPECT(test_string_compare(test_universal, universal) == 0);
  TEST_EXPECT(validate_universal_canonical_path(test_universal));

  TEST_CLEAR_RESULT();
  ne_core_free(table->result, test_universal);
  TEST_EXPECT_TABLE_RESULT();
}